

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

void __thiscall
QFactoryLoader::QFactoryLoader(QFactoryLoader *this,char *iid,QString *suffix,CaseSensitivity cs)

{
  _Rb_tree_header *p_Var1;
  Type *this_00;
  Type *pTVar2;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
  *pQVar3;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QFactoryLoader *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).usedStaticInstances.d.d = (Data *)0x0;
  (this->d).usedStaticInstances.d.ptr = (_func_QObject_ptr **)0x0;
  (this->d).iid.d.size = 0;
  (this->d).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->d).iid.d.d = (Data *)0x0;
  (this->d).iid.d.ptr = (char *)0x0;
  (this->d).usedStaticInstances.d.size = 0;
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker(&(this->d).loadedPaths);
  p_Var1 = &(this->d).keyMap._M_t._M_impl.super__Rb_tree_header;
  (this->d).keyMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->d).keyMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->d).libraries.
  super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->d).libraries.
  super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->d).libraries.
  super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->d).loadedLibraries.d.d = (Data *)0x0;
  (this->d).loadedLibraries.d.ptr = (bool *)0x0;
  (this->d).loadedLibraries.d.size = 0;
  (this->d).keyMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->d).keyMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->d).keyMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->d).suffix.d.d = (Data *)0x0;
  (this->d).suffix.d.ptr = (char16_t *)0x0;
  (this->d).suffix.d.size = 0;
  (this->d).extraSearchPath.d.d = (Data *)0x0;
  (this->d).extraSearchPath.d.ptr = (char16_t *)0x0;
  (this->d).extraSearchPath.d.size = 0;
  QByteArray::operator=((QByteArray *)this,iid);
  (this->d).cs = cs;
  pQVar3 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
            *)&(this->d).suffix;
  QString::operator=((QString *)pQVar3,suffix);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
            ::operator->(pQVar3);
  timeout.t2 = 0;
  timeout.type = 1;
  timeout.t1 = 0x7fffffffffffffff;
  QRecursiveMutex::tryLock(&this_00->mutex,timeout);
  pQVar3 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
            *)this;
  update(this);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
           ::operator->(pQVar3);
  local_30 = this;
  QtPrivate::QPodArrayOps<QFactoryLoader*>::emplace<QFactoryLoader*&>
            ((QPodArrayOps<QFactoryLoader*> *)&pTVar2->loaders,(pTVar2->loaders).d.size,&local_30);
  QList<QFactoryLoader_*>::end(&pTVar2->loaders);
  QRecursiveMutex::unlock(&this_00->mutex);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFactoryLoader::QFactoryLoader(const char *iid,
                               const QString &suffix,
                               Qt::CaseSensitivity cs)
{
    Q_ASSERT_X(suffix.startsWith(u'/'), "QFactoryLoader",
               "For historical reasons, the suffix must start with '/' (and it can't be empty)");

    d->iid = iid;
#if QT_CONFIG(library)
    d->cs = cs;
    d->suffix = suffix;
# ifdef Q_OS_ANDROID
    if (!d->suffix.isEmpty() && d->suffix.at(0) == u'/')
        d->suffix.remove(0, 1);
# endif

    QMutexLocker locker(&qt_factoryloader_global->mutex);
    update();
    qt_factoryloader_global->loaders.append(this);
#else
    Q_UNUSED(suffix);
    Q_UNUSED(cs);
#endif
}